

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

DefinitionSymbol * __thiscall slang::ast::Symbol::getDeclaringDefinition(Symbol *this)

{
  Scope *this_00;
  InstanceBodySymbol *this_01;
  DefinitionSymbol *pDVar1;
  Symbol *in_RDI;
  Scope *scope;
  Symbol *curr;
  Symbol *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    if (local_18->kind == InstanceBody) {
      this_01 = as<slang::ast::InstanceBodySymbol>((Symbol *)0xa2438a);
      pDVar1 = InstanceBodySymbol::getDefinition(this_01);
      return pDVar1;
    }
    this_00 = getParentScope(local_18);
    if (this_00 == (Scope *)0x0) break;
    local_18 = Scope::asSymbol(this_00);
  }
  return (DefinitionSymbol *)0x0;
}

Assistant:

const DefinitionSymbol* Symbol::getDeclaringDefinition() const {
    auto curr = this;
    while (curr->kind != SymbolKind::InstanceBody) {
        auto scope = curr->getParentScope();
        if (!scope)
            return nullptr;

        curr = &scope->asSymbol();
    }

    return &curr->as<InstanceBodySymbol>().getDefinition();
}